

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

void __thiscall Population::evolve(Population *this)

{
  pointer pDVar1;
  int iVar2;
  DNA *dna;
  DNA *dna1;
  DNA *dna2;
  pointer pDVar3;
  ulong uVar4;
  result_type_conflict2 rVar5;
  double local_d0;
  vector<DNA,_std::allocator<DNA>_> new_population;
  uniform_real_distribution<double> local_98;
  DNA local_80;
  DNA newDNA;
  
  new_population.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  new_population.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  new_population.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98._M_param._M_a = 0.0;
  local_98._M_param._M_b = 1.0;
  local_d0 = 0.0;
  uVar4 = 0xffffffffffffffff;
  do {
    uVar4 = uVar4 + 1;
    if ((ulong)(((long)(this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x28) <= uVar4) break;
    random_engine();
    rVar5 = std::uniform_real_distribution<double>::operator()(&local_98,&random_engine::smt);
    dna1 = GetDNAWithProbability(this,rVar5);
    random_engine();
    rVar5 = std::uniform_real_distribution<double>::operator()(&local_98,&random_engine::smt);
    dna2 = GetDNAWithProbability(this,rVar5);
    crossover(&local_80,this,dna1,dna2);
    mutation(&newDNA,this,&local_80);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_80);
    iVar2 = DNA::calcFitness(&newDNA,&this->diophantine_);
    if (iVar2 == 0) {
      this->answerReady = true;
      std::vector<int,_std::allocator<int>_>::operator=(&this->answer,&newDNA.genes);
    }
    else {
      std::vector<DNA,_std::allocator<DNA>_>::push_back(&new_population,&newDNA);
      local_d0 = local_d0 + 1.0 / (double)iVar2;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&newDNA);
  } while (iVar2 != 0);
  std::vector<DNA,_std::allocator<DNA>_>::_M_move_assign(&this->population_,&new_population);
  pDVar1 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pDVar3 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
                super__Vector_impl_data._M_start; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
    pDVar3->likelihood = (1.0 / (double)pDVar3->fitness) / local_d0;
  }
  std::vector<DNA,_std::allocator<DNA>_>::~vector(&new_population);
  return;
}

Assistant:

void Population::evolve() {
    vector<DNA> new_population;
    double invSum = 0.0f;
    uniform_real_distribution<double> real_distribution(0.0, 1.0);

    for (int i = 0; i < population_.size(); ++i) {

        const DNA& dna1 = GetDNAWithProbability(real_distribution(random_engine()));
        const DNA& dna2 = GetDNAWithProbability(real_distribution(random_engine()));
        DNA newDNA = mutation(crossover(dna1, dna2));
        int fitness = newDNA.calcFitness(diophantine_);
        if (fitness == 0) {
            answerReady = true;
            answer = newDNA.genes;
            break;
        }
        invSum += 1.0 / static_cast<double>(fitness);
        new_population.push_back(newDNA);
    }

    population_ = move(new_population);
    for (DNA& dna : population_) {
        dna.likelihood = (1.0 / static_cast<double>(dna.fitness)) / invSum;
    }
}